

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void partial_suite::fail_wstring(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *buffer;
  error *ex;
  undefined1 local_88 [8];
  writer writer;
  string result;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)((long)&result.field_2 + 8),L"bravo");
  buffer = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &writer.stack.c.
            super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)buffer);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::string>
            ((basic_writer<char,16ul> *)local_88,buffer);
  trial::protocol::json::basic_writer<char,_16UL>::value<trial::protocol::json::token::begin_array>
            ((basic_writer<char,_16UL> *)local_88);
  trial::protocol::json::partial::format<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)((long)&result.field_2 + 8),(writer *)local_88
            );
  trial::protocol::core::detail::throw_failed_impl
            ("json::partial::format(data, writer)","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0xf8,"void partial_suite::fail_wstring()");
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer
            ((basic_writer<char,_16UL> *)local_88);
  std::__cxx11::string::~string
            ((string *)
             &writer.stack.c.
              super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)((long)&result.field_2 + 8));
  return;
}

Assistant:

void fail_wstring()
{
    variable data(L"bravo");
    std::string result;
    json::writer writer(result);
    writer.value<json::token::begin_array>();
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(json::partial::format(data, writer),
                                    json::error,
                                    "incompatible type");
}